

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::copy_descriptor_set_layout
          (Impl *this,VkDescriptorSetLayoutCreateInfo *create_info,ScratchAllocator *alloc,
          VkDescriptorSetLayoutCreateInfo **out_create_info)

{
  bool bVar1;
  VkDescriptorSetLayoutCreateInfo *pVVar2;
  VkDescriptorSetLayoutBinding *pVVar3;
  VkSampler_T **ppVVar4;
  VkDescriptorSetLayoutBinding *b;
  uint32_t i;
  VkDescriptorSetLayoutCreateInfo *info;
  VkDescriptorSetLayoutCreateInfo **out_create_info_local;
  ScratchAllocator *alloc_local;
  VkDescriptorSetLayoutCreateInfo *create_info_local;
  Impl *this_local;
  
  pVVar2 = copy<VkDescriptorSetLayoutCreateInfo>(this,create_info,1,alloc);
  pVVar3 = copy<VkDescriptorSetLayoutBinding>
                     (this,pVVar2->pBindings,(ulong)pVVar2->bindingCount,alloc);
  pVVar2->pBindings = pVVar3;
  for (b._4_4_ = 0; b._4_4_ < pVVar2->bindingCount; b._4_4_ = b._4_4_ + 1) {
    pVVar3 = pVVar2->pBindings;
    if ((pVVar3[b._4_4_].pImmutableSamplers == (VkSampler *)0x0) ||
       ((pVVar3[b._4_4_].descriptorType != VK_DESCRIPTOR_TYPE_SAMPLER &&
        (pVVar3[b._4_4_].descriptorType != VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER)))) {
      pVVar3[b._4_4_].pImmutableSamplers = (VkSampler *)0x0;
    }
    else {
      ppVVar4 = copy<VkSampler_T*>(this,pVVar3[b._4_4_].pImmutableSamplers,
                                   (ulong)pVVar3[b._4_4_].descriptorCount,alloc);
      pVVar3[b._4_4_].pImmutableSamplers = ppVVar4;
    }
  }
  bVar1 = copy_pnext_chain(this,create_info->pNext,alloc,&pVVar2->pNext,(DynamicStateInfo *)0x0,0);
  if (bVar1) {
    *out_create_info = pVVar2;
  }
  return bVar1;
}

Assistant:

bool StateRecorder::Impl::copy_descriptor_set_layout(
	const VkDescriptorSetLayoutCreateInfo *create_info, ScratchAllocator &alloc,
	VkDescriptorSetLayoutCreateInfo **out_create_info)
{
	auto *info = copy(create_info, 1, alloc);
	info->pBindings = copy(info->pBindings, info->bindingCount, alloc);

	for (uint32_t i = 0; i < info->bindingCount; i++)
	{
		auto &b = const_cast<VkDescriptorSetLayoutBinding &>(info->pBindings[i]);
		if (b.pImmutableSamplers &&
		    (b.descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER ||
		     b.descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER))
		{
			b.pImmutableSamplers = copy(b.pImmutableSamplers, b.descriptorCount, alloc);
		}
		else
		{
			b.pImmutableSamplers = nullptr;
		}
	}

	if (!copy_pnext_chain(create_info->pNext, alloc, &info->pNext, nullptr, 0))
		return false;

	*out_create_info = info;
	return true;
}